

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

unsigned_long xmlParserFindNodeInfoIndex(xmlParserNodeInfoSeqPtr seq,xmlNodePtr node)

{
  xmlNodePtr pxVar1;
  ulong uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  if (node != (xmlNodePtr)0x0 && seq != (xmlParserNodeInfoSeqPtr)0x0) {
    uVar2 = seq->length;
    uVar4 = 0;
    bVar8 = false;
    uVar5 = 1;
    while ((uVar5 <= uVar2 && (!bVar8))) {
      uVar6 = uVar2 - uVar5 >> 1;
      uVar4 = uVar6 + uVar5;
      uVar7 = (uVar6 + uVar5) - 1;
      pxVar1 = seq->buffer[uVar7].node;
      bVar8 = pxVar1 == node;
      if (pxVar1 <= node) {
        uVar7 = uVar2;
      }
      if (!bVar8) {
        uVar2 = uVar7;
      }
      if (pxVar1 < node) {
        uVar5 = uVar6 + 1 + uVar5;
      }
    }
    if (uVar4 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = uVar4 - 1;
      if (seq->buffer[uVar4 - 1].node < node) {
        uVar3 = uVar4;
      }
    }
    return uVar3;
  }
  return 0xffffffffffffffff;
}

Assistant:

unsigned long
xmlParserFindNodeInfoIndex(xmlParserNodeInfoSeqPtr seq,
                           xmlNodePtr node)
{
    unsigned long upper, lower, middle;
    int found = 0;

    if ((seq == NULL) || (node == NULL))
        return ((unsigned long) -1);

    /* Do a binary search for the key */
    lower = 1;
    upper = seq->length;
    middle = 0;
    while (lower <= upper && !found) {
        middle = lower + (upper - lower) / 2;
        if (node == seq->buffer[middle - 1].node)
            found = 1;
        else if (node < seq->buffer[middle - 1].node)
            upper = middle - 1;
        else
            lower = middle + 1;
    }

    /* Return position */
    if (middle == 0 || seq->buffer[middle - 1].node < node)
        return middle;
    else
        return middle - 1;
}